

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDLimitMeshSealEdgeInfo::SetEdge(ON_SubDLimitMeshSealEdgeInfo *this,uint grid_side_dex)

{
  bool bVar1;
  bool bVar2;
  ON_SubDEdge *this_00;
  ON__UINT_PTR OVar3;
  byte local_50;
  byte local_4e;
  uint local_4c;
  ON__UINT_PTR edge_dir;
  bool bPartialFragment;
  bool bCompleteFragment;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr eptr;
  uint grid_side_dex_local;
  ON_SubDLimitMeshSealEdgeInfo *this_local;
  
  if ((((this->m_fragment != (ON_SubDMeshFragment *)0x0) &&
       (this->m_fragment->m_face != (ON_SubDFace *)0x0)) &&
      (this->m_face_edge_count = this->m_fragment->m_face->m_edge_count, 2 < this->m_face_edge_count
      )) && (this->m_face_edge_count < 0xfff1)) {
    eptr.m_ptr._4_4_ = grid_side_dex;
    edge = (ON_SubDEdge *)ON_SubDMeshFragment::SubDEdgePtr(this->m_fragment,grid_side_dex);
    this_00 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&edge);
    if ((this_00 == (ON_SubDEdge *)0x0) || (this_00->m_face_count < 2)) {
      local_4c = 0;
    }
    else {
      local_4c = (this_00->super_ON_SubDComponentBase).m_id;
    }
    this->m_edge_id = local_4c;
    if (this->m_edge_id != 0) {
      bVar1 = ON_SubDMeshFragment::IsFullFaceFragment(this->m_fragment);
      bVar2 = false;
      if (((!bVar1) && (bVar2 = false, 0xfff0 < this->m_fragment->m_face_vertex_index[0])) &&
         ((bVar2 = false, 0xfff0 < this->m_fragment->m_face_vertex_index[1] &&
          (bVar2 = false, this->m_fragment->m_face_vertex_index[2] < 0xfff0)))) {
        bVar2 = 0xfff0 < this->m_fragment->m_face_vertex_index[3];
      }
      if ((bVar1) || (bVar2)) {
        this->m_bits = '\0';
        OVar3 = ON_SubDEdgePtr::EdgeDirection((ON_SubDEdgePtr *)&edge);
        if (bVar2) {
          if (eptr.m_ptr._4_4_ == 1) {
            local_4e = 0x80;
            if (OVar3 != 0) {
              local_4e = 0x40;
            }
            this->m_bits = this->m_bits | local_4e;
          }
          else {
            if (eptr.m_ptr._4_4_ != 2) goto LAB_008e4453;
            local_50 = 0x40;
            if (OVar3 != 0) {
              local_50 = 0x80;
            }
            this->m_bits = this->m_bits | local_50;
          }
        }
        if (OVar3 != 0) {
          this->m_bits = this->m_bits | 1;
        }
        bVar2 = ON_SubDEdge::IsSmooth(this_00);
        if (bVar2) {
          this->m_bits = this->m_bits | 2;
        }
        this->m_grid_side_dex = (uchar)eptr.m_ptr._4_4_;
        return true;
      }
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                 ,0xc52,"","Unexpected m_face_vertex[] falues in partial fragment.");
    }
  }
LAB_008e4453:
  this->m_edge_id = 0;
  this->m_bits = '\0';
  this->m_grid_side_dex = '\0';
  this->m_face_edge_count = 0;
  return false;
}

Assistant:

bool SetEdge(
    unsigned int grid_side_dex
  )
  {
    for (;;)
    {
      if (nullptr == m_fragment || nullptr == m_fragment->m_face)
        break;

      m_face_edge_count = m_fragment->m_face->m_edge_count;
      if (m_face_edge_count < 3 || m_face_edge_count > ON_SubDFace::MaximumEdgeCount)
        break; // bogus face

      const ON_SubDEdgePtr eptr = m_fragment->SubDEdgePtr(grid_side_dex);
      const ON_SubDEdge* edge = eptr.Edge();
      m_edge_id = (nullptr != edge && edge->m_face_count >= 2) ? edge->m_id : 0;
      if (0 == m_edge_id)
        break; // nothing to seal

      const bool bCompleteFragment = m_fragment->IsFullFaceFragment();
      const bool bPartialFragment
        = (false == bCompleteFragment)
        && m_fragment->m_face_vertex_index[0] > ON_SubDFace::MaximumEdgeCount
        && m_fragment->m_face_vertex_index[1] > ON_SubDFace::MaximumEdgeCount
        && m_fragment->m_face_vertex_index[2] < ON_SubDFace::MaximumEdgeCount
        && m_fragment->m_face_vertex_index[3] > ON_SubDFace::MaximumEdgeCount
        ;

      if (false == bCompleteFragment && false == bPartialFragment)
      {
        ON_SUBD_ERROR("Unexpected m_face_vertex[] falues in partial fragment.");
        break;
      }

      m_bits = 0;
      const ON__UINT_PTR edge_dir = eptr.EdgeDirection();
      if (bPartialFragment)
      {
        // The high bit is used for partial fragments so they will sort after full fragments.
        if ( 1 == grid_side_dex )
          m_bits |= (0==edge_dir) ? Bits::SecondHalf : Bits::FirstHalf;
        else if ( 2 == grid_side_dex )
          m_bits |= (0==edge_dir) ? Bits::FirstHalf : Bits::SecondHalf;
        else
        {
          // this is an interior edge of a partial fragment and it
          // is always sealed with its neighbor when it is created.
          break;
        }
      }
      if (0 != edge_dir)
        m_bits |= Bits::EdgeDir;
      if (edge->IsSmooth())
        m_bits |= Bits::Smooth;

      m_grid_side_dex = (unsigned char)grid_side_dex; // 0,1,2, or 3

      return true;
    }


    m_edge_id = 0;
    m_bits = 0;
    m_grid_side_dex = 0;
    m_face_edge_count = 0;
    return false;
  }